

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

StringEqualsMatcher *
Catch::Matchers::Equals
          (StringEqualsMatcher *__return_storage_ptr__,string *str,CaseSensitive caseSensitivity)

{
  undefined1 auStack_38 [40];
  
  CasedString::CasedString((CasedString *)auStack_38,str,caseSensitivity);
  StringEqualsMatcher::StringEqualsMatcher(__return_storage_ptr__,(CasedString *)auStack_38);
  std::__cxx11::string::~string((string *)(auStack_38 + 8));
  return __return_storage_ptr__;
}

Assistant:

StringEqualsMatcher Equals( std::string const& str, CaseSensitive caseSensitivity ) {
        return StringEqualsMatcher( CasedString( str, caseSensitivity) );
    }